

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void get_default_volpan(DUMB_IT_SIGDATA *sigdata,IT_CHANNEL *channel)

{
  uint uVar1;
  IT_SAMPLE *pIVar2;
  IT_INSTRUMENT *pIVar3;
  ulong uVar4;
  
  uVar4 = (ulong)channel->sample;
  if (uVar4 != 0) {
    pIVar2 = sigdata->sample;
    channel->volume = pIVar2[channel->sample - 1].default_volume;
    uVar1 = sigdata->flags;
    if ((uVar1 & 0x40) == 0) {
      if ((char)pIVar2[uVar4 - 1].default_pan < -0x3f) {
        channel->pan = pIVar2[uVar4 - 1].default_pan & 0x7f;
        return;
      }
      if ((uVar1 & 4) != 0) {
        pIVar3 = sigdata->instrument;
        uVar4 = (ulong)channel->instrument;
        if (pIVar3[uVar4 - 1].default_pan < 0x41) {
          channel->pan = pIVar3[uVar4 - 1].default_pan;
        }
        if ((char)pIVar3[uVar4 - 1].filter_cutoff < '\0') {
          channel->filter_cutoff = pIVar3[uVar4 - 1].filter_cutoff & 0x7f;
        }
        if ((char)pIVar3[uVar4 - 1].filter_resonance < '\0') {
          channel->filter_resonance = pIVar3[uVar4 - 1].filter_resonance & 0x7f;
        }
      }
    }
    else if (-1 < (char)uVar1) {
      channel->truepan = (ushort)pIVar2[uVar4 - 1].default_pan << 6 | 0x20;
      return;
    }
  }
  return;
}

Assistant:

static void get_default_volpan(DUMB_IT_SIGDATA *sigdata, IT_CHANNEL *channel)
{
	if (channel->sample == 0)
		return;

	channel->volume = sigdata->sample[channel->sample-1].default_volume;

	if (sigdata->flags & IT_WAS_AN_XM) {
		if (!(sigdata->flags & IT_WAS_A_MOD))
			channel->truepan = 32 + sigdata->sample[channel->sample-1].default_pan*64;
		return;
	}

	{
		int pan = sigdata->sample[channel->sample-1].default_pan;
		if (pan >= 128 && pan <= 192) {
			channel->pan = pan - 128;
			return;
		}
	}

	if (sigdata->flags & IT_USE_INSTRUMENTS) {
		IT_INSTRUMENT *instrument = &sigdata->instrument[channel->instrument-1];
		if (instrument->default_pan <= 64)
			channel->pan = instrument->default_pan;
		if (instrument->filter_cutoff >= 128)
			channel->filter_cutoff = instrument->filter_cutoff - 128;
		if (instrument->filter_resonance >= 128)
			channel->filter_resonance = instrument->filter_resonance - 128;
	}
}